

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::DiskSourceTree::MapPath
          (DiskSourceTree *this,string_view virtual_path,string_view disk_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  compiler *pcVar4;
  string_view path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  string local_88;
  Mapping local_68;
  
  pcVar4 = (compiler *)disk_path._M_len;
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,virtual_path._M_str,virtual_path._M_str + virtual_path._M_len);
  path._M_str = (char *)pcVar4;
  path._M_len = (size_t)disk_path._M_str;
  CanonicalizePath_abi_cxx11_(&local_88,(compiler *)disk_path._M_len,path);
  paVar1 = &local_68.virtual_path.field_2;
  if (local_a8 == &local_98) {
    local_68.virtual_path.field_2._8_8_ = local_98._8_8_;
    local_68.virtual_path._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.virtual_path._M_dataplus._M_p = (pointer)local_a8;
  }
  local_68.virtual_path.field_2._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
  local_68.virtual_path.field_2._M_local_buf[0] = local_98._M_local_buf[0];
  paVar2 = &local_68.disk_path.field_2;
  local_68.virtual_path._M_string_length = local_a0;
  local_a0 = 0;
  local_98._M_local_buf[0] = '\0';
  paVar3 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar3) {
    local_68.disk_path.field_2._8_8_ = local_88.field_2._8_8_;
    local_68.disk_path._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_68.disk_path._M_dataplus._M_p = local_88._M_dataplus._M_p;
  }
  local_68.disk_path.field_2._M_allocated_capacity._1_7_ =
       local_88.field_2._M_allocated_capacity._1_7_;
  local_68.disk_path.field_2._M_local_buf[0] = local_88.field_2._M_local_buf[0];
  local_68.disk_path._M_string_length = local_88._M_string_length;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_a8 = &local_98;
  local_88._M_dataplus._M_p = (pointer)paVar3;
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::emplace_back<google::protobuf::compiler::DiskSourceTree::Mapping>(&this->mappings_,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.disk_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.disk_path._M_dataplus._M_p,
                    local_68.disk_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.virtual_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.virtual_path._M_dataplus._M_p,
                    local_68.virtual_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar3) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(local_98._M_allocated_capacity._1_7_,local_98._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void DiskSourceTree::MapPath(absl::string_view virtual_path,
                             absl::string_view disk_path) {
  mappings_.push_back(
      Mapping(std::string(virtual_path), CanonicalizePath(disk_path)));
}